

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit_p.cpp
# Opt level: O2

QWidget * __thiscall
QLineEditPrivate::addAction
          (QLineEditPrivate *this,QAction *newAction,QAction *before,ActionPosition position,
          int flags)

{
  QWidget *parent;
  SideWidgetEntry *e;
  QWidgetAction *this_00;
  QLineEditIconButton *this_01;
  SideWidgetLocation SVar1;
  pointer pSVar2;
  const_iterator __position;
  SideWidgetEntryList *this_02;
  long in_FS_OFFSET;
  undefined1 local_60 [8];
  undefined1 local_58 [8];
  QArrayDataPointer<char16_t> local_50;
  QWidgetData *local_38;
  
  local_38 = *(QWidgetData **)(in_FS_OFFSET + 0x28);
  if (newAction == (QAction *)0x0) {
    this_01 = (QLineEditIconButton *)0x0;
    goto LAB_003f33ae;
  }
  parent = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  if (((this->leadingSideWidgets).
       super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       (this->leadingSideWidgets).
       super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     ((this->trailingSideWidgets).
      super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->trailingSideWidgets).
      super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    local_50.d = (Data *)textChanged;
    local_50.ptr = (char16_t *)0x0;
    QObjectPrivate::
    connect<void(QLineEdit::*)(QString_const&),void(QLineEditPrivate::*)(QString_const&)>
              ((Object *)local_58,(offset_in_QLineEdit_to_subr)parent,
               (Object *)QLineEdit::textChanged,0,(ConnectionType)this);
    QMetaObject::Connection::~Connection((Connection *)local_58);
    QLineEdit::text((QString *)&local_50,(QLineEdit *)parent);
    this->lastTextSize = (uint)local_50.size;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  this_00 = QtPrivate::qobject_cast_helper<QWidgetAction*,QObject>((QObject *)newAction);
  if (this_00 == (QWidgetAction *)0x0) {
LAB_003f3245:
    this_01 = (QLineEditIconButton *)operator_new(0x38);
    QLineEditIconButton::QLineEditIconButton(this_01,parent);
    QAction::icon();
    QAbstractButton::setIcon((QAbstractButton *)this_01,(QIcon *)&local_50);
    QIcon::~QIcon((QIcon *)&local_50);
    QLineEditIconButton::setOpacity(this_01,(double)((flags & 1U) == 0 || 0 < this->lastTextSize));
    if ((flags & 4U) != 0) {
      local_50.d = (Data *)clearButtonClicked;
      local_50.ptr = (char16_t *)0x0;
      QObjectPrivate::connect<void(QAbstractButton::*)(bool),void(QLineEditPrivate::*)()>
                ((Object *)local_60,(offset_in_QAbstractButton_to_subr)this_01,
                 (Object *)QAbstractButton::clicked,0,(ConnectionType)this);
      QMetaObject::Connection::~Connection((Connection *)local_60);
      this_01->m_hideWithText = true;
    }
    QToolButton::setDefaultAction((QToolButton *)this_01,newAction);
  }
  else {
    this_01 = (QLineEditIconButton *)QWidgetAction::requestWidget(this_00,parent);
    if (this_01 == (QLineEditIconButton *)0x0) goto LAB_003f3245;
    flags = flags | 2;
  }
  if (before == (QAction *)0x0) {
    if (position == TrailingPosition && (flags & 4U) == 0) {
      for (pSVar2 = (this->trailingSideWidgets).
                    super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pSVar2 != (this->trailingSideWidgets).
                    super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pSVar2 = pSVar2 + 1) {
        if ((pSVar2->flags & 4) != 0) {
          before = pSVar2->action;
          if (before != (QAction *)0x0) goto LAB_003f3305;
          break;
        }
      }
    }
    this_02 = &this->leadingSideWidgets;
    if (position == TrailingPosition) {
      this_02 = &this->trailingSideWidgets;
    }
LAB_003f3386:
    __position._M_current =
         (this_02->
         super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
         )._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
LAB_003f3305:
    SVar1 = findSideWidget(this,before);
    this_02 = &this->leadingSideWidgets;
    if (SVar1.position == TrailingPosition) {
      this_02 = &this->trailingSideWidgets;
    }
    if ((long)SVar1 < 0) goto LAB_003f3386;
    __position._M_current =
         (this_02->
         super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
         )._M_impl.super__Vector_impl_data._M_start + ((ulong)SVar1 >> 0x20);
  }
  local_50.d = (Data *)this_01;
  local_50.ptr = (char16_t *)newAction;
  local_50.size._0_4_ = flags;
  std::vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
  ::_M_insert_rval(this_02,__position,(value_type *)&local_50);
  positionSideWidgets(this);
  QWidget::show((QWidget *)this_01);
LAB_003f33ae:
  if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_38) {
    return (QWidget *)this_01;
  }
  __stack_chk_fail();
}

Assistant:

QWidget *QLineEditPrivate::addAction(QAction *newAction, QAction *before, QLineEdit::ActionPosition position, int flags)
{
    Q_Q(QLineEdit);
    if (!newAction)
        return nullptr;
    if (!hasSideWidgets()) { // initial setup.
        QObjectPrivate::connect(q, &QLineEdit::textChanged,
                                this, &QLineEditPrivate::textChanged);
        lastTextSize = q->text().size();
    }
    QWidget *w = nullptr;
    // Store flags about QWidgetAction here since removeAction() may be called from ~QAction,
    // in which a qobject_cast<> no longer works.
    if (QWidgetAction *widgetAction = qobject_cast<QWidgetAction *>(newAction)) {
        if ((w = widgetAction->requestWidget(q)))
            flags |= SideWidgetCreatedByWidgetAction;
    }
    if (!w) {
#if QT_CONFIG(toolbutton)
        QLineEditIconButton *toolButton = new QLineEditIconButton(q);
        toolButton->setIcon(newAction->icon());
        toolButton->setOpacity(lastTextSize > 0 || !(flags & SideWidgetFadeInWithText) ? 1 : 0);
        if (flags & SideWidgetClearButton) {
            QObjectPrivate::connect(toolButton, &QToolButton::clicked,
                                    this, &QLineEditPrivate::clearButtonClicked);

#if QT_CONFIG(animation)
            // The clear button is handled only by this widget. The button should be really
            // shown/hidden in order to calculate size hints correctly.
            toolButton->setHideWithText(true);
#endif
        }
        toolButton->setDefaultAction(newAction);
        w = toolButton;
#else
        return nullptr;
#endif
    }

    // QTBUG-59957: clear button should be the leftmost action.
    if (!before && !(flags & SideWidgetClearButton) && position == QLineEdit::TrailingPosition) {
        for (const SideWidgetEntry &e : trailingSideWidgets) {
            if (e.flags & SideWidgetClearButton) {
                before = e.action;
                break;
            }
        }
    }

    // If there is a 'before' action, it takes preference

    // There's a bug in GHS compiler that causes internal error on the following code.
    // The affected GHS compiler versions are 2016.5.4 and 2017.1. GHS internal reference
    // to track the progress of this issue is TOOLS-26637.
    // This temporary workaround allows to compile with GHS toolchain and should be
    // removed when GHS provides a patch to fix the compiler issue.

#if defined(Q_CC_GHS)
    const SideWidgetLocation loc = {position, -1};
    const auto location = before ? findSideWidget(before) : loc;
#else
    const auto location = before ? findSideWidget(before) : SideWidgetLocation{position, -1};
#endif

    SideWidgetEntryList &list = location.position == QLineEdit::TrailingPosition ? trailingSideWidgets : leadingSideWidgets;
    list.insert(location.isValid() ? list.begin() + location.index : list.end(),
                SideWidgetEntry(w, newAction, flags));
    positionSideWidgets();
    w->show();
    return w;
}